

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O2

int __thiscall pstore::region::file_based_factory::init(file_based_factory *this,EVP_PKEY_CTX *ctx)

{
  __shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,
             (__shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2> *)(ctx + 0x18));
  factory::create<pstore::file::file_handle,pstore::memory_mapper>
            ((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              *)this,(factory *)ctx,(shared_ptr<pstore::file::file_handle> *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return (int)this;
}

Assistant:

auto file_based_factory::init () -> std::vector<memory_mapper_ptr> {
            return this->create<file::file_handle, memory_mapper> (file_);
        }